

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O1

bool __thiscall
S2MinDistanceShapeIndexTarget::UpdateMinDistance
          (S2MinDistanceShapeIndexTarget *this,S2Cell *cell,S2MinDistance *min_dist)

{
  S2ClosestEdgeQuery *pSVar1;
  Result RVar2;
  CellTarget target;
  Options local_68;
  Target local_48;
  undefined **local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  VType local_28;
  VType VStack_20;
  VType local_18;
  VType VStack_10;
  
  local_40 = &PTR__S2Region_002c17b8;
  local_38 = *(undefined8 *)&cell->face_;
  uStack_30 = *(undefined8 *)((long)&(cell->id_).id_ + 5);
  local_28 = (cell->uv_).bounds_[0].bounds_.c_[0];
  VStack_20 = (cell->uv_).bounds_[0].bounds_.c_[1];
  local_18 = (cell->uv_).bounds_[1].bounds_.c_[0];
  VStack_10 = (cell->uv_).bounds_[1].bounds_.c_[1];
  local_48._vptr_S2DistanceTarget = (_func_int **)&PTR__S2MinDistanceCellTarget_002c1bb8;
  *(double *)
   &(((this->query_)._M_t.
      super___uniq_ptr_impl<S2ClosestEdgeQuery,_std::default_delete<S2ClosestEdgeQuery>_>._M_t.
      super__Tuple_impl<0UL,_S2ClosestEdgeQuery_*,_std::default_delete<S2ClosestEdgeQuery>_>.
      super__Head_base<0UL,_S2ClosestEdgeQuery_*,_false>._M_head_impl)->options_).super_Options =
       (min_dist->super_S1ChordAngle).length2_;
  pSVar1 = (this->query_)._M_t.
           super___uniq_ptr_impl<S2ClosestEdgeQuery,_std::default_delete<S2ClosestEdgeQuery>_>._M_t.
           super__Tuple_impl<0UL,_S2ClosestEdgeQuery_*,_std::default_delete<S2ClosestEdgeQuery>_>.
           super__Head_base<0UL,_S2ClosestEdgeQuery_*,_false>._M_head_impl;
  local_68.max_distance_.super_S1ChordAngle.length2_ =
       *(S1ChordAngle *)&(pSVar1->options_).super_Options;
  local_68.max_error_.length2_ = ((Delta *)((long)&(pSVar1->options_).super_Options + 8))->length2_;
  local_68._20_4_ =
       SUB84((ulong)*(undefined8 *)((long)&(pSVar1->options_).super_Options + 0x10) >> 0x20,0);
  local_68.max_results_ = 1;
  RVar2 = S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdge(&pSVar1->base_,&local_48,&local_68)
  ;
  if (-1 < RVar2.shape_id_) {
    (min_dist->super_S1ChordAngle).length2_ = (double)RVar2.distance_.super_S1ChordAngle.length2_;
  }
  return -1 < RVar2.shape_id_;
}

Assistant:

bool S2MinDistanceShapeIndexTarget::UpdateMinDistance(
    const S2Cell& cell, S2MinDistance* min_dist) {
  S2ClosestEdgeQuery::CellTarget target(cell);
  return UpdateMinDistance(&target, min_dist);
}